

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O3

int __thiscall Fl_Tree_Item_Array::remove(Fl_Tree_Item_Array *this,char *__filename)

{
  int iVar1;
  Fl_Tree_Item *this_00;
  int extraout_EAX;
  Fl_Tree_Item **ppFVar2;
  int iVar3;
  long lVar4;
  uint index;
  long lVar5;
  
  index = (uint)__filename;
  ppFVar2 = this->_items;
  lVar5 = (long)(int)index;
  this_00 = ppFVar2[lVar5];
  if (this_00 != (Fl_Tree_Item *)0x0) {
    Fl_Tree_Item::~Fl_Tree_Item(this_00);
    operator_delete(this_00,0x88);
    ppFVar2 = this->_items;
  }
  ppFVar2[lVar5] = (Fl_Tree_Item *)0x0;
  iVar1 = this->_total;
  iVar3 = iVar1 + -1;
  this->_total = iVar3;
  if ((int)index < iVar3) {
    lVar4 = lVar5 + 1;
    do {
      this->_items[lVar4 + -1] = this->_items[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
    if ((int)index < iVar3) {
      lVar5 = lVar5 << 3;
      goto LAB_0020742b;
    }
  }
  if (iVar1 <= (int)index || (int)index < 1) {
    return (int)CONCAT71((int7)(int3)((uint)iVar1 >> 8),iVar1 <= (int)index || (int)index < 1);
  }
  index = index - 1;
  lVar5 = (ulong)index * 8;
LAB_0020742b:
  Fl_Tree_Item::update_prev_next(*(Fl_Tree_Item **)(lVar5 + (long)this->_items),index);
  return extraout_EAX;
}

Assistant:

void Fl_Tree_Item_Array::remove(int index) {
  if ( _items[index] ) {			// delete if non-zero
#if FLTK_ABI_VERSION >= 10303
    if ( _flags & MANAGE_ITEM )
#endif
      delete _items[index];
  }
  _items[index] = 0;
  _total--;
  for ( int i=index; i<_total; i++ ) {		// reshuffle the array
    _items[i] = _items[i+1];
  }
#if FLTK_ABI_VERSION >= 10303
  if ( _flags & MANAGE_ITEM ) 
#endif
  {
    if ( index < _total ) {			// removed item not last?
      _items[index]->update_prev_next(index);	// update next item's prev/next and neighbors
    } else if ( ((index-1) >= 0) &&		// removed item IS last?
	      ((index-1) < _total)) {
      _items[index-1]->update_prev_next(index-1);// update prev item's prev/next and neighbors
    }
  }
}